

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::NanoVDBMediumProvider::Density
          (NanoVDBMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  ValueT c;
  Vec3<float> xyz;
  Vec3<float> local_30;
  SampledSpectrum local_20;
  
  local_30.mVec[2] = (p->super_Tuple3<pbrt::Point3,_float>).z;
  local_30.mVec[0] = (p->super_Tuple3<pbrt::Point3,_float>).x;
  local_30.mVec[1] = (p->super_Tuple3<pbrt::Point3,_float>).y;
  xyz = nanovdb::Map::applyInverseMapF<nanovdb::Vec3<float>>
                  (&(this->densityFloatGrid->super_GridData).mMap,&local_30);
  local_30.mVec._0_8_ = this->densityFloatGrid + 1;
  c = nanovdb::
      SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
      ::operator()<float,_nanovdb::Vec3>
                ((SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
                  *)&local_30,xyz);
  SampledSpectrum::SampledSpectrum(&local_20,c);
  return (array<float,_4>)(array<float,_4>)local_20;
}

Assistant:

Density(const Point3f &p, const SampledWavelengths &lambda) const {
        nanovdb::Vec3<float> pIndex =
            densityFloatGrid->worldToIndexF(nanovdb::Vec3<float>(p.x, p.y, p.z));
        using Sampler = nanovdb::SampleFromVoxels<nanovdb::FloatGrid::TreeType, 1, false>;
        Float density = Sampler(densityFloatGrid->tree())(pIndex);
        return SampledSpectrum(density);
    }